

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O0

void BuilderTests<GrpcLikeMessageBuilder,_GrpcLikeMessageBuilder>::empty_builder_movector_test(void)

{
  SizeT SVar1;
  SizeT SVar2;
  size_t dst_size;
  GrpcLikeMessageBuilder dst;
  size_t src_size;
  GrpcLikeMessageBuilder src;
  
  GrpcLikeMessageBuilder::GrpcLikeMessageBuilder((GrpcLikeMessageBuilder *)&src_size);
  SVar1 = flatbuffers::FlatBufferBuilderImpl<false>::GetSize((FlatBufferBuilderImpl<false> *)&src);
  GrpcLikeMessageBuilder::GrpcLikeMessageBuilder
            ((GrpcLikeMessageBuilder *)&dst_size,(GrpcLikeMessageBuilder *)&src_size);
  SVar2 = flatbuffers::FlatBufferBuilderImpl<false>::GetSize((FlatBufferBuilderImpl<false> *)&dst);
  TestEq<unsigned_long,int>
            ((ulong)SVar1,0,"\'src_size\' != \'0\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
             ,0x57,
             "static void BuilderTests<GrpcLikeMessageBuilder>::empty_builder_movector_test() [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
            );
  TestEq<unsigned_long,unsigned_long>
            ((ulong)SVar1,(ulong)SVar2,"\'src_size\' != \'dst_size\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
             ,0x58,
             "static void BuilderTests<GrpcLikeMessageBuilder>::empty_builder_movector_test() [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
            );
  GrpcLikeMessageBuilder::~GrpcLikeMessageBuilder((GrpcLikeMessageBuilder *)&dst_size);
  GrpcLikeMessageBuilder::~GrpcLikeMessageBuilder((GrpcLikeMessageBuilder *)&src_size);
  return;
}

Assistant:

static void empty_builder_movector_test() {
    SrcBuilder src;
    size_t src_size = src.GetSize();
    DestBuilder dst(std::move(src));
    size_t dst_size = dst.GetSize();
    TEST_EQ_FUNC(src_size, 0);
    TEST_EQ_FUNC(src_size, dst_size);
  }